

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identification_strategy.cpp
# Opt level: O0

unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
 __thiscall
license::hw_identifier::IdentificationStrategy::get_strategy
          (IdentificationStrategy *this,LCC_API_HW_IDENTIFICATION_STRATEGY strategy)

{
  Ethernet *pEVar1;
  pointer pIVar2;
  logic_error *this_00;
  unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  local_48;
  unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  local_40;
  unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  local_38 [3];
  unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  local_20;
  undefined1 local_15;
  LCC_API_HW_IDENTIFICATION_STRATEGY local_14;
  IdentificationStrategy *pIStack_10;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy_local;
  unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  *result;
  
  local_15 = 0;
  local_14 = strategy;
  pIStack_10 = this;
  std::
  unique_ptr<license::hw_identifier::IdentificationStrategy,std::default_delete<license::hw_identifier::IdentificationStrategy>>
  ::unique_ptr<std::default_delete<license::hw_identifier::IdentificationStrategy>,void>
            ((unique_ptr<license::hw_identifier::IdentificationStrategy,std::default_delete<license::hw_identifier::IdentificationStrategy>>
              *)this);
  switch(local_14) {
  case STRATEGY_ETHERNET:
    pEVar1 = (Ethernet *)operator_new(0x10);
    Ethernet::Ethernet(pEVar1,false);
    std::
    unique_ptr<license::hw_identifier::IdentificationStrategy,std::default_delete<license::hw_identifier::IdentificationStrategy>>
    ::unique_ptr<std::default_delete<license::hw_identifier::IdentificationStrategy>,void>
              ((unique_ptr<license::hw_identifier::IdentificationStrategy,std::default_delete<license::hw_identifier::IdentificationStrategy>>
                *)local_38,(pointer)pEVar1);
    std::
    unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    ::operator=((unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
                 *)this,local_38);
    std::
    unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    ::~unique_ptr(local_38);
    break;
  case STRATEGY_IP_ADDRESS:
    pEVar1 = (Ethernet *)operator_new(0x10);
    Ethernet::Ethernet(pEVar1,true);
    std::
    unique_ptr<license::hw_identifier::IdentificationStrategy,std::default_delete<license::hw_identifier::IdentificationStrategy>>
    ::unique_ptr<std::default_delete<license::hw_identifier::IdentificationStrategy>,void>
              ((unique_ptr<license::hw_identifier::IdentificationStrategy,std::default_delete<license::hw_identifier::IdentificationStrategy>>
                *)&local_40,(pointer)pEVar1);
    std::
    unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    ::operator=((unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
                 *)this,&local_40);
    std::
    unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    ::~unique_ptr(&local_40);
    break;
  case STRATEGY_DISK:
    pIVar2 = (pointer)operator_new(8);
    DiskStrategy::DiskStrategy((DiskStrategy *)pIVar2);
    std::
    unique_ptr<license::hw_identifier::IdentificationStrategy,std::default_delete<license::hw_identifier::IdentificationStrategy>>
    ::unique_ptr<std::default_delete<license::hw_identifier::IdentificationStrategy>,void>
              ((unique_ptr<license::hw_identifier::IdentificationStrategy,std::default_delete<license::hw_identifier::IdentificationStrategy>>
                *)&local_48,pIVar2);
    std::
    unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    ::operator=((unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
                 *)this,&local_48);
    std::
    unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    ::~unique_ptr(&local_48);
    break;
  case STRATEGY_DEFAULT:
    pIVar2 = (pointer)operator_new(8);
    DefaultStrategy::DefaultStrategy((DefaultStrategy *)pIVar2);
    std::
    unique_ptr<license::hw_identifier::IdentificationStrategy,std::default_delete<license::hw_identifier::IdentificationStrategy>>
    ::unique_ptr<std::default_delete<license::hw_identifier::IdentificationStrategy>,void>
              ((unique_ptr<license::hw_identifier::IdentificationStrategy,std::default_delete<license::hw_identifier::IdentificationStrategy>>
                *)&local_20,pIVar2);
    std::
    unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    ::operator=((unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
                 *)this,&local_20);
    std::
    unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
    ::~unique_ptr(&local_20);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"strategy not supported");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return (__uniq_ptr_data<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>,_true,_true>
          )(__uniq_ptr_data<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<IdentificationStrategy> IdentificationStrategy::get_strategy(LCC_API_HW_IDENTIFICATION_STRATEGY strategy) {
	unique_ptr<IdentificationStrategy> result;
	switch (strategy) {
		case STRATEGY_DEFAULT:
			result = unique_ptr<IdentificationStrategy>(dynamic_cast<IdentificationStrategy*>(new DefaultStrategy()));
			break;
		case STRATEGY_ETHERNET:
			result = unique_ptr<IdentificationStrategy>(dynamic_cast<IdentificationStrategy*>(new Ethernet(false)));
			break;
		case STRATEGY_IP_ADDRESS:
			result = unique_ptr<IdentificationStrategy>(dynamic_cast<IdentificationStrategy*>(new Ethernet(true)));
			break;
		case STRATEGY_DISK:
			result = unique_ptr<IdentificationStrategy>(dynamic_cast<IdentificationStrategy*>(new DiskStrategy()));
			break;
		default:
			throw logic_error("strategy not supported");
	}
	return result;
}